

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwGetKey(GLFWwindow *handle,int key)

{
  int iVar1;
  
  if (_glfw.initialized == 0) {
    iVar1 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (key - 0x15dU < 0xfffffec3) {
    iVar1 = 0;
    _glfwInputError(0x10003,"Invalid key %i");
  }
  else {
    iVar1 = (int)(char)handle[(ulong)(uint)key + 0x88];
    if (iVar1 == 3) {
      handle[(ulong)(uint)key + 0x88] = (GLFWwindow)0x0;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

GLFWAPI int glfwGetKey(GLFWwindow* handle, int key)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_RELEASE);

    if (key < GLFW_KEY_SPACE || key > GLFW_KEY_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid key %i", key);
        return GLFW_RELEASE;
    }

    if (window->keys[key] == _GLFW_STICK)
    {
        // Sticky mode: release key now
        window->keys[key] = GLFW_RELEASE;
        return GLFW_PRESS;
    }

    return (int) window->keys[key];
}